

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinR2SCANL_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  double vlb;
  double vla;
  double local_40;
  double local_38;
  
  uVar3 = 0;
  uVar1 = (ulong)(uint)N;
  if (N < 1) {
    uVar1 = uVar3;
  }
  pdVar2 = sigma + 2;
  for (; uVar1 << 4 != uVar3; uVar3 = uVar3 + 0x10) {
    kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinR2SCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
    eval_exc_vxc_polar(*(double *)((long)rho + uVar3),*(double *)((long)rho + uVar3 + 8),pdVar2[-2],
                       pdVar2[-1],*pdVar2,*(double *)((long)lapl + uVar3),
                       *(double *)((long)lapl + uVar3 + 8),*(double *)((long)tau + uVar3),
                       *(double *)((long)tau + uVar3 + 8),eps,(double *)((long)vrho + uVar3),
                       (double *)((long)vrho + uVar3 + 8),vsigma,vsigma + 1,vsigma + 2,&local_38,
                       &local_40,(double *)((long)vtau + uVar3),(double *)((long)vtau + uVar3 + 8));
    *(double *)((long)vlapl + uVar3) = local_38;
    *(double *)((long)vlapl + uVar3 + 8) = local_40;
    eps = eps + 1;
    vsigma = vsigma + 3;
    pdVar2 = pdVar2 + 3;
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;


    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double vla, vlb;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      eps[i], vrho_i[0], vrho_i[1],
      vsigma_i[0], vsigma_i[1], vsigma_i[2], vla, vlb,
      vtau_i[0], vtau_i[1] );
    if(traits::needs_laplacian) {
      vlapl_i[0] = vla;
      vlapl_i[1] = vlb;
    }

  }

}